

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall helics::CommonCore::setIdentifier(CommonCore *this,string_view name)

{
  InvalidFunctionCall *this_00;
  string_view message;
  string_view name_local;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  if ((this->super_BrokerBase).brokerState._M_i == CREATED) {
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&(this->super_BrokerBase).identifier,&name_local);
    return;
  }
  this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
  message._M_str = "setIdentifier can only be called before the core is initialized";
  message._M_len = 0x3f;
  InvalidFunctionCall::InvalidFunctionCall(this_00,message);
  __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setIdentifier(std::string_view name)
{
    if (getBrokerState() == BrokerState::CREATED) {
        identifier = name;
    } else {
        throw(
            InvalidFunctionCall("setIdentifier can only be called before the core is initialized"));
    }
}